

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_reshape_before_binaryop(NetOptimize *this)

{
  int iVar1;
  int iVar2;
  value_type pLVar3;
  value_type pLVar4;
  FILE *__stream;
  bool bVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  size_type sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  reference pvVar12;
  long in_RDI;
  int bottom_blob_index_final;
  BinaryOp *binaryop;
  size_t j;
  int top_blob_index;
  Reshape *reshape;
  size_t i;
  size_t layer_count;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  size_type local_30;
  size_type local_18;
  
  sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (sVar6 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar5) {
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pLVar3 = *ppLVar7;
      if (((*(int *)&pLVar3[1]._vptr_Layer == 1) &&
          (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 1)) &&
         (iVar1._0_1_ = pLVar3[1].support_tensor_storage,
         iVar1._1_1_ = pLVar3[1].support_weight_fp16_storage,
         iVar1._2_1_ = pLVar3[1].support_reserved_0, iVar1._3_1_ = pLVar3[1].support_reserved_1,
         iVar1 == 0)) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
        iVar1 = *pvVar8;
        local_30 = local_18;
        do {
          do {
            do {
              local_30 = local_30 + 1;
              if (sVar6 <= local_30) goto LAB_0015cc35;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_30);
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0),
                                      (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                       in_stack_ffffffffffffff98));
            } while (bVar5);
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_30);
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
          } while (sVar9 != 2);
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
          if (*pvVar8 == iVar1) break;
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,1);
        } while (*pvVar8 != iVar1);
LAB_0015cc35:
        if (local_30 != sVar6) {
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          __stream = _stderr;
          pLVar4 = *ppLVar7;
          uVar10 = std::__cxx11::string::c_str();
          uVar11 = std::__cxx11::string::c_str();
          fprintf(__stream,"eliminate_reshape_before_binaryop %s %s\n",uVar10,uVar11);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->bottoms,0);
          iVar2 = *pvVar8;
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
          if (*pvVar8 == iVar1) {
            in_stack_ffffffffffffffa4 = iVar2;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->bottoms,0);
            *pvVar8 = in_stack_ffffffffffffffa4;
          }
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,1);
          if (*pvVar8 == iVar1) {
            in_stack_ffffffffffffffa0 = iVar2;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->bottoms,1);
            *pvVar8 = in_stack_ffffffffffffffa0;
          }
          in_stack_ffffffffffffff9c = (int)local_30;
          pvVar12 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                               (long)iVar2);
          pvVar12->consumer = in_stack_ffffffffffffff9c;
          std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_reshape_before_binaryop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Reshape")
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[i];
        if (reshape->w != 1 || reshape->h != 1 || reshape->permute != 0)
            continue;

        // Reshape - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        fprintf(stderr, "eliminate_reshape_before_binaryop %s %s\n", reshape->name.c_str(), binaryop->name.c_str());

        int bottom_blob_index_final = reshape->bottoms[0];
        if (layers[j]->bottoms[0] == top_blob_index)
            binaryop->bottoms[0] = bottom_blob_index_final;
        if (layers[j]->bottoms[1] == top_blob_index)
            binaryop->bottoms[1] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumer = j;
        reshape->type = "ncnnfused";
    }

    return 0;
}